

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O1

void __thiscall libtorrent::aux::utp_socket_impl::send_reset(utp_socket_impl *this,uint16_t ack_nr)

{
  _Atomic_word *p_Var1;
  ushort uVar2;
  uint uVar3;
  utp_socket_manager *this_00;
  char *p;
  char *pcVar4;
  long lVar5;
  int iVar6;
  char *p_1;
  undefined1 *puVar7;
  unsigned_short val_1;
  char *p_2;
  utp_header h;
  error_code ec;
  weak_ptr<libtorrent::aux::utp_socket_interface> local_78;
  char local_64 [8];
  undefined1 local_5c [4];
  undefined4 local_58;
  undefined1 local_54 [4];
  error_code local_50;
  basic_endpoint<boost::asio::ip::udp> local_3c;
  
  pcVar4 = local_64 + 2;
  local_64[0] = '1';
  local_64[1] = '\0';
  uVar2 = this->m_send_id;
  iVar6 = 8;
  do {
    *pcVar4 = (char)(uVar2 >> ((byte)iVar6 & 0x1f));
    pcVar4 = pcVar4 + 1;
    iVar6 = iVar6 + -8;
  } while (iVar6 != -8);
  uVar3 = this->m_reply_micro;
  iVar6 = 0x18;
  puVar7 = local_5c;
  do {
    *puVar7 = (char)(uVar3 >> ((byte)iVar6 & 0x1f));
    puVar7 = puVar7 + 1;
    iVar6 = iVar6 + -8;
  } while (iVar6 != -8);
  puVar7 = local_54;
  local_58 = 0;
  lVar5 = random((aux *)0xffff);
  iVar6 = 8;
  do {
    *puVar7 = (char)(((uint)lVar5 & 0xffff) >> ((byte)iVar6 & 0x1f));
    puVar7 = puVar7 + 1;
    iVar6 = iVar6 + -8;
  } while (iVar6 != -8);
  puVar7 = local_54 + 2;
  iVar6 = 8;
  do {
    *puVar7 = (char)(ack_nr >> ((byte)iVar6 & 0x1f));
    puVar7 = puVar7 + 1;
    iVar6 = iVar6 + -8;
  } while (iVar6 != -8);
  lVar5 = ::std::chrono::_V2::system_clock::now();
  iVar6 = 0x18;
  pcVar4 = local_64 + 4;
  do {
    *pcVar4 = (char)((uint)((int)(SUB168(SEXT816(lVar5) * SEXT816(0x20c49ba5e353f7cf),8) >> 7) -
                           (SUB164(SEXT816(lVar5) * SEXT816(0x20c49ba5e353f7cf),0xc) >> 0x1f)) >>
                    ((byte)iVar6 & 0x1f));
    pcVar4 = pcVar4 + 1;
    iVar6 = iVar6 + -8;
  } while (iVar6 != -8);
  local_50.val_ = 0;
  local_50.failed_ = false;
  local_50.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  local_78.super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (this->m_sock).
           super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this_00 = this->m_sm;
  local_78.super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (this->m_sock).
       super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_78.super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_78.super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count =
           (local_78.
            super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_78.super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count =
           (local_78.
            super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_weak_count + 1;
    }
  }
  boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::basic_endpoint
            (&local_3c,&this->m_remote_address,this->m_port);
  utp_socket_manager::send_packet
            (this_00,&local_78,&local_3c,local_64,0x14,&local_50,(udp_send_flags_t)0x0);
  if (local_78.super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_78.
                 super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_weak_count;
      iVar6 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar6 = (local_78.
               super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count;
      (local_78.super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count = iVar6 + -1;
    }
    if (iVar6 == 1) {
      (*(local_78.
         super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  return;
}

Assistant:

void utp_socket_impl::send_reset(std::uint16_t const ack_nr)
{
	INVARIANT_CHECK;

	utp_header h;
	h.type_ver = (ST_RESET << 4) | 1;
	h.extension = utp_no_extension;
	h.connection_id = m_send_id;
	h.timestamp_difference_microseconds = m_reply_micro;
	h.wnd_size = 0;
	h.seq_nr = std::uint16_t(random(0xffff));
	h.ack_nr = ack_nr;
	time_point const now = clock_type::now();
	h.timestamp_microseconds = std::uint32_t(
		total_microseconds(now.time_since_epoch()) & 0xffffffff);

	UTP_LOGV("%8p: send_reset seq_nr:%d id:%d ack_nr:%d\n"
		, static_cast<void*>(this), int(h.seq_nr), int(m_send_id), int(ack_nr));

	// ignore errors here
	error_code ec;
	m_sm.send_packet(m_sock, udp::endpoint(m_remote_address, m_port)
		, reinterpret_cast<char const*>(&h), sizeof(h), ec);
	if (ec)
	{
		UTP_LOGV("%8p: socket error: %s\n"
			, static_cast<void*>(this)
			, ec.message().c_str());
	}
}